

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# resStrash.c
# Opt level: O1

Abc_Ntk_t * Res_WndStrash(Res_Win_t *p)

{
  anon_union_8_4_617c9805_for_Abc_Obj_t__17 *paVar1;
  ulong uVar2;
  uint uVar3;
  void *pvVar4;
  Abc_Ntk_t *pAVar5;
  int iVar6;
  Abc_Ntk_t *pNtk;
  char *pcVar7;
  Abc_Obj_t *pAVar8;
  Abc_Obj_t *pAVar9;
  Vec_Ptr_t *pVVar10;
  void **ppvVar11;
  int *piVar12;
  Vec_Ptr_t *pVVar13;
  uint uVar14;
  int Fill;
  undefined8 extraout_RDX;
  undefined8 extraout_RDX_00;
  undefined8 extraout_RDX_01;
  undefined8 uVar15;
  long lVar16;
  int iVar17;
  long lVar18;
  
  if (p->pNode->pNtk->ntkFunc != ABC_FUNC_AIG) {
    __assert_fail("Abc_NtkHasAig(p->pNode->pNtk)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/opt/res/resStrash.c"
                  ,0x37,"Abc_Ntk_t *Res_WndStrash(Res_Win_t *)");
  }
  pNtk = Abc_NtkAlloc(ABC_NTK_STRASH,ABC_FUNC_AIG,1);
  pcVar7 = Extra_UtilStrsav("window");
  pNtk->pName = pcVar7;
  pVVar10 = p->vLeaves;
  if (0 < pVVar10->nSize) {
    lVar18 = 0;
    do {
      pvVar4 = pVVar10->pArray[lVar18];
      pAVar8 = Abc_NtkCreateObj(pNtk,ABC_OBJ_PI);
      *(Abc_Obj_t **)((long)pvVar4 + 0x40) = pAVar8;
      lVar18 = lVar18 + 1;
      pVVar10 = p->vLeaves;
    } while (lVar18 < pVVar10->nSize);
  }
  pVVar10 = p->vBranches;
  if (0 < pVVar10->nSize) {
    lVar18 = 0;
    do {
      pvVar4 = pVVar10->pArray[lVar18];
      pAVar8 = Abc_NtkCreateObj(pNtk,ABC_OBJ_PI);
      *(Abc_Obj_t **)((long)pvVar4 + 0x40) = pAVar8;
      lVar18 = lVar18 + 1;
      pVVar10 = p->vBranches;
    } while (lVar18 < pVVar10->nSize);
  }
  pVVar10 = p->vNodes;
  if (0 < pVVar10->nSize) {
    lVar18 = 0;
    do {
      pAVar8 = (Abc_Obj_t *)pVVar10->pArray[lVar18];
      pAVar9 = Abc_ConvertAigToAig(pNtk,pAVar8);
      (pAVar8->field_6).pCopy = pAVar9;
      if (pAVar8 == p->pNode) {
        (pAVar8->field_6).pTemp = (void *)((ulong)pAVar9 ^ 1);
      }
      lVar18 = lVar18 + 1;
      pVVar10 = p->vNodes;
    } while (lVar18 < pVVar10->nSize);
  }
  iVar6 = p->vRoots->nSize;
  pVVar10 = (Vec_Ptr_t *)malloc(0x10);
  iVar17 = 8;
  if (6 < iVar6 * 2 - 1U) {
    iVar17 = iVar6 * 2;
  }
  pVVar10->nSize = 0;
  pVVar10->nCap = iVar17;
  if (iVar17 == 0) {
    ppvVar11 = (void **)0x0;
  }
  else {
    ppvVar11 = (void **)malloc((long)iVar17 << 3);
  }
  pVVar10->pArray = ppvVar11;
  pVVar13 = p->vRoots;
  if (0 < pVVar13->nSize) {
    lVar18 = 0;
    do {
      pvVar4 = *(void **)((long)pVVar13->pArray[lVar18] + 0x40);
      uVar3 = pVVar10->nCap;
      if (pVVar10->nSize == uVar3) {
        if ((int)uVar3 < 0x10) {
          if (pVVar10->pArray == (void **)0x0) {
            ppvVar11 = (void **)malloc(0x80);
          }
          else {
            ppvVar11 = (void **)realloc(pVVar10->pArray,0x80);
          }
          iVar6 = 0x10;
        }
        else {
          iVar6 = uVar3 * 2;
          if (iVar6 <= (int)uVar3) goto LAB_00467c96;
          if (pVVar10->pArray == (void **)0x0) {
            ppvVar11 = (void **)malloc((ulong)uVar3 << 4);
          }
          else {
            ppvVar11 = (void **)realloc(pVVar10->pArray,(ulong)uVar3 << 4);
          }
        }
        pVVar10->pArray = ppvVar11;
        pVVar10->nCap = iVar6;
      }
LAB_00467c96:
      iVar6 = pVVar10->nSize;
      uVar14 = iVar6 + 1;
      pVVar10->nSize = uVar14;
      pVVar10->pArray[iVar6] = pvVar4;
      uVar3 = pVVar10->nCap;
      if (uVar14 == uVar3) {
        if ((int)uVar3 < 0x10) {
          if (pVVar10->pArray == (void **)0x0) {
            ppvVar11 = (void **)malloc(0x80);
          }
          else {
            ppvVar11 = (void **)realloc(pVVar10->pArray,0x80);
          }
          iVar6 = 0x10;
        }
        else {
          iVar6 = uVar3 * 2;
          if (iVar6 <= (int)uVar3) goto LAB_00467d05;
          if (pVVar10->pArray == (void **)0x0) {
            ppvVar11 = (void **)malloc((ulong)uVar3 << 4);
          }
          else {
            ppvVar11 = (void **)realloc(pVVar10->pArray,(ulong)uVar3 << 4);
          }
        }
        pVVar10->pArray = ppvVar11;
        pVVar10->nCap = iVar6;
      }
LAB_00467d05:
      iVar6 = pVVar10->nSize;
      pVVar10->nSize = iVar6 + 1;
      pVVar10->pArray[iVar6] = (void *)0x0;
      lVar18 = lVar18 + 1;
      pVVar13 = p->vRoots;
    } while (lVar18 < pVVar13->nSize);
  }
  pAVar5 = p->pNode->pNtk;
  if ((pAVar5->vTravIds).pArray == (int *)0x0) {
    iVar6 = pAVar5->vObjs->nSize;
    uVar2 = (long)iVar6 + 500;
    iVar17 = (int)uVar2;
    if ((pAVar5->vTravIds).nCap < iVar17) {
      piVar12 = (int *)malloc(uVar2 * 4);
      (pAVar5->vTravIds).pArray = piVar12;
      if (piVar12 == (int *)0x0) {
        __assert_fail("p->pArray",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecInt.h"
                      ,0x20c,"void Vec_IntGrow(Vec_Int_t *, int)");
      }
      (pAVar5->vTravIds).nCap = iVar17;
    }
    if (-500 < iVar6) {
      memset((pAVar5->vTravIds).pArray,0,(uVar2 & 0xffffffff) << 2);
    }
    (pAVar5->vTravIds).nSize = iVar17;
  }
  iVar6 = pAVar5->nTravIds;
  pAVar5->nTravIds = iVar6 + 1;
  if (0x3ffffffe < iVar6) {
    __assert_fail("p->nTravIds < (1<<30)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/abc/abc.h"
                  ,0x197,"void Abc_NtkIncrementTravId(Abc_Ntk_t *)");
  }
  Res_WinSweepLeafTfo_rec(p->pNode,(*(uint *)&p->pNode->field_0x14 >> 0xc) + p->nWinTfoMax);
  paVar1 = &p->pNode->field_6;
  paVar1->pTemp = (void *)((ulong)paVar1->pTemp ^ 1);
  pAVar5 = p->pNode->pNtk;
  iVar6 = pAVar5->nTravIds;
  iVar17 = p->pNode->Id;
  Vec_IntFillExtra(&pAVar5->vTravIds,iVar17 + 1,Fill);
  if (((long)iVar17 < 0) || ((pAVar5->vTravIds).nSize <= iVar17)) {
    __assert_fail("i >= 0 && i < p->nSize",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecInt.h"
                  ,0x1c0,"void Vec_IntWriteEntry(Vec_Int_t *, int, int)");
  }
  (pAVar5->vTravIds).pArray[iVar17] = iVar6 + -1;
  pVVar13 = p->vNodes;
  if (0 < pVVar13->nSize) {
    lVar18 = 0;
    uVar15 = extraout_RDX;
    do {
      pAVar8 = (Abc_Obj_t *)pVVar13->pArray[lVar18];
      pAVar5 = pAVar8->pNtk;
      iVar6 = pAVar8->Id;
      Vec_IntFillExtra(&pAVar5->vTravIds,iVar6 + 1,(int)uVar15);
      if (((long)iVar6 < 0) || ((pAVar5->vTravIds).nSize <= iVar6)) {
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecInt.h"
                      ,0x19e,"int Vec_IntEntry(Vec_Int_t *, int)");
      }
      uVar15 = extraout_RDX_00;
      if ((pAVar5->vTravIds).pArray[iVar6] == pAVar8->pNtk->nTravIds) {
        pAVar9 = Abc_ConvertAigToAig(pNtk,pAVar8);
        (pAVar8->field_6).pCopy = pAVar9;
        uVar15 = extraout_RDX_01;
      }
      lVar18 = lVar18 + 1;
      pVVar13 = p->vNodes;
    } while (lVar18 < pVVar13->nSize);
  }
  pVVar13 = p->vRoots;
  if (0 < pVVar13->nSize) {
    iVar6 = pVVar10->nSize;
    lVar18 = 1;
    lVar16 = 0;
    do {
      if (iVar6 <= lVar18) {
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecPtr.h"
                      ,0x1a6,"void Vec_PtrWriteEntry(Vec_Ptr_t *, int, void *)");
      }
      pVVar10->pArray[lVar18] =
           *(void **)(*(long *)((long)pVVar13->pArray + lVar18 * 4 + -4) + 0x40);
      lVar16 = lVar16 + 1;
      pVVar13 = p->vRoots;
      lVar18 = lVar18 + 2;
    } while (lVar16 < pVVar13->nSize);
  }
  pAVar8 = Abc_AigMiter((Abc_Aig_t *)pNtk->pManFunc,pVVar10,0);
  pAVar9 = Abc_NtkCreateObj(pNtk,ABC_OBJ_PO);
  Abc_ObjAddFanin(pAVar9,pAVar8);
  if (pVVar10->pArray != (void **)0x0) {
    free(pVVar10->pArray);
    pVVar10->pArray = (void **)0x0;
  }
  free(pVVar10);
  pAVar8 = Abc_NtkCreateObj(pNtk,ABC_OBJ_PO);
  Abc_ObjAddFanin(pAVar8,(p->pNode->field_6).pCopy);
  pAVar8 = p->pNode;
  if (0 < (pAVar8->vFanins).nSize) {
    lVar18 = 0;
    do {
      pvVar4 = pAVar8->pNtk->vObjs->pArray[(pAVar8->vFanins).pArray[lVar18]];
      pAVar8 = Abc_NtkCreateObj(pNtk,ABC_OBJ_PO);
      Abc_ObjAddFanin(pAVar8,*(Abc_Obj_t **)((long)pvVar4 + 0x40));
      lVar18 = lVar18 + 1;
      pAVar8 = p->pNode;
    } while (lVar18 < (pAVar8->vFanins).nSize);
  }
  pVVar10 = p->vDivs;
  if (0 < pVVar10->nSize) {
    lVar18 = 0;
    do {
      pvVar4 = pVVar10->pArray[lVar18];
      pAVar8 = Abc_NtkCreateObj(pNtk,ABC_OBJ_PO);
      Abc_ObjAddFanin(pAVar8,*(Abc_Obj_t **)((long)pvVar4 + 0x40));
      lVar18 = lVar18 + 1;
      pVVar10 = p->vDivs;
    } while (lVar18 < pVVar10->nSize);
  }
  Abc_NtkAddDummyPiNames(pNtk);
  Abc_NtkAddDummyPoNames(pNtk);
  iVar6 = Abc_NtkCheck(pNtk);
  if (iVar6 == 0) {
    fwrite("Res_WndStrash(): Network check has failed.\n",0x2b,1,_stdout);
  }
  return pNtk;
}

Assistant:

Abc_Ntk_t * Res_WndStrash( Res_Win_t * p )
{
    Vec_Ptr_t * vPairs;
    Abc_Ntk_t * pAig;
    Abc_Obj_t * pObj, * pMiter;
    int i;
    assert( Abc_NtkHasAig(p->pNode->pNtk) );
//    Abc_NtkCleanCopy( p->pNode->pNtk );
    // create the network
    pAig = Abc_NtkAlloc( ABC_NTK_STRASH, ABC_FUNC_AIG, 1 );
    pAig->pName = Extra_UtilStrsav( "window" );
    // create the inputs
    Vec_PtrForEachEntry( Abc_Obj_t *, p->vLeaves, pObj, i )
        pObj->pCopy = Abc_NtkCreatePi( pAig );
    Vec_PtrForEachEntry( Abc_Obj_t *, p->vBranches, pObj, i )
        pObj->pCopy = Abc_NtkCreatePi( pAig );
    // go through the nodes in the topological order
    Vec_PtrForEachEntry( Abc_Obj_t *, p->vNodes, pObj, i )
    {
        pObj->pCopy = Abc_ConvertAigToAig( pAig, pObj );
        if ( pObj == p->pNode )
            pObj->pCopy = Abc_ObjNot( pObj->pCopy );
    }
    // collect the POs
    vPairs = Vec_PtrAlloc( 2 * Vec_PtrSize(p->vRoots) );
    Vec_PtrForEachEntry( Abc_Obj_t *, p->vRoots, pObj, i )
    {
        Vec_PtrPush( vPairs, pObj->pCopy );
        Vec_PtrPush( vPairs, NULL );
    }
    // mark the TFO of the node
    Abc_NtkIncrementTravId( p->pNode->pNtk );
    Res_WinSweepLeafTfo_rec( p->pNode, (int)p->pNode->Level + p->nWinTfoMax );
    // update strashing of the node
    p->pNode->pCopy = Abc_ObjNot( p->pNode->pCopy );
    Abc_NodeSetTravIdPrevious( p->pNode );
    // redo strashing in the TFO
    Vec_PtrForEachEntry( Abc_Obj_t *, p->vNodes, pObj, i )
    {
        if ( Abc_NodeIsTravIdCurrent(pObj) )
            pObj->pCopy = Abc_ConvertAigToAig( pAig, pObj );
    }
    // collect the POs
    Vec_PtrForEachEntry( Abc_Obj_t *, p->vRoots, pObj, i )
        Vec_PtrWriteEntry( vPairs, 2 * i + 1, pObj->pCopy );
    // add the miter
    pMiter = Abc_AigMiter( (Abc_Aig_t *)pAig->pManFunc, vPairs, 0 );
    Abc_ObjAddFanin( Abc_NtkCreatePo(pAig), pMiter );
    Vec_PtrFree( vPairs );
    // add the node
    Abc_ObjAddFanin( Abc_NtkCreatePo(pAig), p->pNode->pCopy );
    // add the fanins
    Abc_ObjForEachFanin( p->pNode, pObj, i )
        Abc_ObjAddFanin( Abc_NtkCreatePo(pAig), pObj->pCopy );
    // add the divisors
    Vec_PtrForEachEntry( Abc_Obj_t *, p->vDivs, pObj, i )
        Abc_ObjAddFanin( Abc_NtkCreatePo(pAig), pObj->pCopy );
    // add the names
    Abc_NtkAddDummyPiNames( pAig );
    Abc_NtkAddDummyPoNames( pAig );
    // check the resulting network
    if ( !Abc_NtkCheck( pAig ) )
        fprintf( stdout, "Res_WndStrash(): Network check has failed.\n" );
    return pAig;
}